

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O3

string * __thiscall
LiteScript::_Type_NAMESPACE::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_NAMESPACE *this,Variable *object)

{
  Namespace *this_00;
  int iVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  Object *pOVar4;
  char *__s;
  size_t sVar5;
  uint idx;
  stringstream ss;
  string local_1e8;
  undefined1 local_1c8 [32];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  pOVar4 = Variable::operator->(object);
  this_00 = (Namespace *)pOVar4->data;
  uVar3 = Namespace::Count(this_00);
  if (uVar3 != 0) {
    idx = 0;
    do {
      __s = Namespace::GetKey(this_00,idx);
      iVar1 = (int)(ostream *)local_1a8;
      if (__s == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      Namespace::GetVariable((Namespace *)local_1c8,(uint)this_00);
      Variable::operator_cast_to_string(&local_1e8,(Variable *)local_1c8);
      _Var2._M_p = local_1e8._M_dataplus._M_p;
      if (local_1e8._M_dataplus._M_p == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar5 = strlen(local_1e8._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var2._M_p,sVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      Variable::~Variable((Variable *)local_1c8);
      if (idx < uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      }
      idx = idx + 1;
    } while (uVar3 != idx);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_NAMESPACE::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Namespace& nsp = object->GetData<Namespace>();
    for (unsigned int i = 0, sz = nsp.Count(); i < sz; i++) {
        ss << nsp.GetKey(i) << ":" << ((std::string)(nsp.GetVariable(i))).c_str();
        if (i < sz - 1)
            ss << ",";
    }
    ss << "}";
    return ss.str();
}